

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::BasicReporter::StartSection(BasicReporter *this,string *sectionName,string *param_3)

{
  SpanInfo *this_00;
  long in_RDI;
  value_type *in_stack_ffffffffffffff98;
  
  this_00 = (SpanInfo *)(in_RDI + 0xa0);
  SpanInfo::SpanInfo(this_00,&in_stack_ffffffffffffff98->name);
  std::vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>::
  push_back((vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
             *)this_00,in_stack_ffffffffffffff98);
  SpanInfo::~SpanInfo((SpanInfo *)0x181f12);
  return;
}

Assistant:

virtual void StartSection( const std::string& sectionName, const std::string& ) {
            m_sectionSpans.push_back( SpanInfo( sectionName ) );
        }